

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_all_seg.c
# Opt level: O0

int agg_all_seg(feat_t *fcb,segdmp_type_t type,char *fn,uint32 stride)

{
  int32 iVar1;
  int iVar2;
  cmd_ln_t *cmdln;
  long lVar3;
  char *pcVar4;
  FILE *local_98;
  FILE *local_90;
  uint local_88;
  int local_84;
  int32 no_retries;
  long start;
  FILE *pFStack_70;
  uint32 ignore;
  FILE *fp;
  uint32 *veclen;
  uint32 n_stream;
  uint32 t;
  uint32 j;
  uint32 i;
  vector_t **feat;
  uint32 blksz;
  uint32 n_out_frame;
  int32 n_frame;
  uint32 mfc_veclen;
  vector_t *mfcc;
  uint32 seq_no;
  uint32 stride_local;
  char *fn_local;
  feat_t *pfStack_18;
  segdmp_type_t type_local;
  feat_t *fcb_local;
  
  _n_frame = (mfcc_t **)0x0;
  mfcc._4_4_ = stride;
  _seq_no = fn;
  fn_local._4_4_ = type;
  pfStack_18 = fcb;
  cmdln = cmd_ln_get();
  lVar3 = cmd_ln_int_r(cmdln,"-ceplen");
  n_out_frame = (uint32)lVar3;
  _j = (mfcc_t ***)0x0;
  start._4_4_ = 0;
  local_84 = 0;
  if (pfStack_18->n_sv == 0) {
    local_88 = pfStack_18->n_stream;
  }
  else {
    local_88 = pfStack_18->n_sv;
  }
  veclen._0_4_ = local_88;
  if (pfStack_18->lda == (mfcc_t ***)0x0) {
    if (pfStack_18->sv_len == (uint32 *)0x0) {
      local_98 = (FILE *)pfStack_18->stream_len;
    }
    else {
      local_98 = (FILE *)pfStack_18->sv_len;
    }
    local_90 = local_98;
  }
  else {
    local_90 = (FILE *)&pfStack_18->out_dim;
  }
  fp = local_90;
  feat._0_4_ = 0;
  for (t = 0; t < local_88; t = t + 1) {
    feat._0_4_ = (&local_90->_flags)[t] + (int)feat;
  }
  pFStack_70 = (FILE *)open_dmp(_seq_no);
  lVar3 = ftell(pFStack_70);
  iVar1 = bio_fwrite(&t,4,1,(FILE *)pFStack_70,0,(uint32 *)((long)&start + 4));
  if (iVar1 == 1) {
    mfcc._0_4_ = corpus_get_begin();
    n_stream = 0;
    feat._4_4_ = 0;
    while (iVar2 = corpus_next_utt(), iVar2 != 0) {
      if (_n_frame != (mfcc_t **)0x0) {
        free(*_n_frame);
        ckd_free(_n_frame);
        _n_frame = (mfcc_t **)0x0;
      }
      iVar2 = corpus_get_generic_featurevec((vector_t **)&n_frame,(int32 *)&blksz,n_out_frame);
      if (iVar2 < 0) {
        pcVar4 = corpus_utt();
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                ,0x7d,"Can\'t read input features from %s\n",pcVar4);
        exit(1);
      }
      if ((uint32)mfcc % 1000 == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                ,0x81,"[%u]\n",(ulong)(uint32)mfcc);
      }
      if (_j != (mfcc_t ***)0x0) {
        feat_array_free(_j);
        _j = (mfcc_t ***)0x0;
      }
      if ((int)blksz < 9) {
        pcVar4 = corpus_utt();
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                ,0x8a,"utt %s too short\n",pcVar4);
        if (_n_frame != (mfcc_t **)0x0) {
          ckd_free(*_n_frame);
          ckd_free(_n_frame);
          _n_frame = (mfcc_t **)0x0;
        }
      }
      else {
        _j = feat_array_alloc(pfStack_18,blksz + pfStack_18->window_size);
        feat_s2mfc2feat_live(pfStack_18,_n_frame,(int32 *)&blksz,1,1,_j);
        for (veclen._4_4_ = pfStack_18->window_size; veclen._4_4_ < blksz - pfStack_18->window_size;
            veclen._4_4_ = veclen._4_4_ + 1) {
          if (n_stream % mfcc._4_4_ == 0) {
            while (iVar1 = bio_fwrite(*_j[veclen._4_4_],4,(int)feat,(FILE *)pFStack_70,0,
                                      (uint32 *)((long)&start + 4)), iVar1 != (int)feat) {
              if (agg_all_seg::rpt == 0) {
                err_msg_system(ERR_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                               ,0x9f,"Unable to write to dmp file");
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                        ,0xa0,"sleeping...\n");
                local_84 = local_84 + 1;
              }
              sleep(3);
              if (10 < local_84) {
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                        ,0xa6,
                        "Failed to write to a dmp file after 10 retries of getting MFCC(about 30 seconds)\n "
                       );
                exit(1);
              }
            }
            feat._4_4_ = feat._4_4_ + 1;
          }
          n_stream = n_stream + 1;
        }
      }
      mfcc._0_4_ = (uint32)mfcc + 1;
    }
    iVar2 = fseek(pFStack_70,lVar3,0);
    if (iVar2 < 0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                     ,0xaf,"Unable to seek to begin of dmp");
      fcb_local._4_4_ = -1;
    }
    else {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
              ,0xb4,"Wrote %u frames to %s\n",(ulong)feat._4_4_,_seq_no);
      iVar1 = bio_fwrite((void *)((long)&feat + 4),4,1,(FILE *)pFStack_70,0,
                         (uint32 *)((long)&start + 4));
      if (iVar1 == 1) {
        fcb_local._4_4_ = 0;
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                       ,0xb7,"Unable to write to dmp file");
        fcb_local._4_4_ = -1;
      }
    }
  }
  else {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/agg_all_seg.c"
                   ,0x6d,"Unable to write to dmp file");
    fcb_local._4_4_ = -1;
  }
  return fcb_local._4_4_;
}

Assistant:

int
agg_all_seg(feat_t *fcb,
	    segdmp_type_t type,
	    const char *fn,
	    uint32 stride)
{
    uint32 seq_no;
    vector_t *mfcc = NULL;
    uint32 mfc_veclen = cmd_ln_int32("-ceplen");
    int32 n_frame;
    uint32 n_out_frame;
    uint32 blksz=0;
    vector_t **feat = NULL;
    uint32 i, j;
    uint32 t;
    uint32 n_stream;
    uint32 *veclen;
    FILE *fp;
    uint32 ignore = 0;
    long start;
    int32 no_retries=0;
    
    n_stream = feat_dimension1(fcb);
    veclen = feat_stream_lengths(fcb);
    for (i = 0, blksz = 0; i < n_stream; i++)
        blksz += veclen[i];

    fp = open_dmp(fn);

    start = ftell(fp);

    if (bio_fwrite(&i, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	E_ERROR_SYSTEM("Unable to write to dmp file");

	return S3_ERROR;
    }

    for (seq_no = corpus_get_begin(), j = 0, n_out_frame = 0;
	 corpus_next_utt(); seq_no++) {
	    if (mfcc) {
		free(mfcc[0]);
		ckd_free(mfcc);

		mfcc = NULL;
	    }

	    /* get the MFCC data for the utterance */
	    if (corpus_get_generic_featurevec(&mfcc, &n_frame, mfc_veclen) < 0) {
	      E_FATAL("Can't read input features from %s\n", corpus_utt());
	    }

	if ((seq_no % 1000) == 0) {
	    E_INFO("[%u]\n", seq_no);
	}

	    if (feat) {
		feat_array_free(feat);
		feat = NULL;
	    }
	    
	    if (n_frame < 9) {
	      E_WARN("utt %s too short\n", corpus_utt());
	      if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
		mfcc = NULL;
	      }
	      continue;
	    }

	    feat = feat_array_alloc(fcb, n_frame + feat_window_size(fcb));
	    feat_s2mfc2feat_live(fcb, mfcc, &n_frame, TRUE, TRUE, feat);

	    for (t = feat_window_size(fcb); t < n_frame - feat_window_size(fcb); t++, j++) {
		if ((j % stride) == 0) {
		    while (bio_fwrite(&feat[t][0][0],
				   sizeof(float32),
				   blksz,
				   fp, 0, &ignore) != blksz) {
			static int rpt = 0;

			if (!rpt) {
			    E_ERROR_SYSTEM("Unable to write to dmp file");
			    E_INFO("sleeping...\n");
			    no_retries++;
			}
			sleep(3);

			if(no_retries > 10){
			  E_FATAL("Failed to write to a dmp file after 10 retries of getting MFCC(about 30 seconds)\n ");
			}
		    }
		    ++n_out_frame;
		}
	    }
    }

    if (fseek(fp, start, SEEK_SET) < 0) {
	E_ERROR_SYSTEM("Unable to seek to begin of dmp");

	return S3_ERROR;
    }

    E_INFO("Wrote %u frames to %s\n", n_out_frame, fn);

    if (bio_fwrite((void *)&n_out_frame, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	E_ERROR_SYSTEM("Unable to write to dmp file");
	
	return S3_ERROR;
    }

    return S3_SUCCESS;
}